

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O2

int nsync::cv_enqueue(void *v,nsync_waiter_s *nw)

{
  uint32_t uVar1;
  nsync_dll_list_ pnVar2;
  
  uVar1 = nsync_spin_test_and_set_((nsync_atomic_uint32_ *)v,1,1,0);
  pnVar2 = nsync_dll_make_last_in_list_(*(nsync_dll_list_ *)((long)v + 8),&nw->q);
  *(nsync_dll_list_ *)((long)v + 8) = pnVar2;
  (nw->waiting).super___atomic_base<unsigned_int>._M_i = 1;
  *(uint32_t *)v = uVar1 | 2;
  return 1;
}

Assistant:

static int cv_enqueue (void *v, struct nsync_waiter_s *nw) {
	nsync_cv *pcv = (nsync_cv *) v;
	/* acquire spinlock */
	uint32_t old_word = nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK, CV_SPINLOCK, 0);
	pcv->waiters = nsync_dll_make_last_in_list_ (pcv->waiters, &nw->q);
	ATM_STORE (&nw->waiting, 1);
	/* Release spinlock. */
	ATM_STORE_REL (&pcv->word, old_word | CV_NON_EMPTY); /* release store */
	return (1);
}